

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QNetworkRequest::Attribute,_QVariant> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_>::
findNode<QNetworkRequest::Attribute>
          (Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *this,Attribute *key)

{
  long lVar1;
  bool bVar2;
  Node<QNetworkRequest::Attribute,_QVariant> *pNVar3;
  Attribute *in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QNetworkRequest::Attribute,_QVariant>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QNetworkRequest::Attribute>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Bucket::isUnused((Bucket *)0x197c6b);
  if (bVar2) {
    pNVar3 = (Node<QNetworkRequest::Attribute,_QVariant> *)0x0;
  }
  else {
    pNVar3 = Bucket::node((Bucket *)0x197c86);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }